

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void localfunc(LexState *ls)

{
  int iVar1;
  FuncState *fs_00;
  TString *name;
  LocVar *pLVar2;
  FuncState *fs;
  expdesc b;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  b._16_8_ = ls;
  name = str_checkname(ls);
  new_localvar(ls,name);
  adjustlocalvars((LexState *)b._16_8_,1);
  body((LexState *)b._16_8_,(expdesc *)&fs,0,*(int *)(b._16_8_ + 4));
  iVar1 = fs_00->pc;
  pLVar2 = getlocvar(fs_00,b.k);
  pLVar2->startpc = iVar1;
  return;
}

Assistant:

static void localfunc (LexState *ls) {
  expdesc b;
  FuncState *fs = ls->fs;
  new_localvar(ls, str_checkname(ls));  /* new local variable */
  adjustlocalvars(ls, 1);  /* enter its scope */
  body(ls, &b, 0, ls->linenumber);  /* function created in next register */
  /* debug information will only see the variable after this point! */
  getlocvar(fs, b.u.info)->startpc = fs->pc;
}